

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

int32_t __thiscall
icu_63::NFRule::findText
          (NFRule *this,UnicodeString *str,UnicodeString *key,int32_t startingAt,int32_t *length)

{
  short sVar1;
  bool bVar2;
  int32_t start;
  int8_t iVar3;
  int32_t start_00;
  int32_t iVar4;
  int iVar5;
  undefined4 uVar6;
  int32_t iVar7;
  UnicodeString *this_00;
  FieldPosition local_138;
  UnicodeString suffix;
  UnicodeString prefix;
  Formattable result;
  
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    iVar5 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])
                      ();
    if ((char)iVar5 == '\0') {
      sVar1 = (key->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (key->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      *length = iVar5;
      iVar7 = UnicodeString::indexOf(str,key,startingAt);
      return iVar7;
    }
    iVar7 = findTextLenient(this,str,key,startingAt,length);
    return iVar7;
  }
  Formattable::Formattable(&result);
  local_138.super_UObject._vptr_UObject = (_func_int **)&PTR__FieldPosition_003a2e18;
  local_138.fField = 0;
  local_138.fEndIndex = 0;
  local_138.fBeginIndex = startingAt;
  PluralFormat::parseType(this->rulePatternFormat,str,this,&result,&local_138);
  iVar7 = local_138.fBeginIndex;
  if (-1 < local_138.fBeginIndex) {
    this_00 = &this->fRuleText;
    start_00 = UnicodeString::indexOf(this_00,L"$(",-1,0);
    iVar4 = UnicodeString::indexOf(this_00,L")$",-1,start_00);
    start = local_138.fEndIndex;
    UnicodeString::tempSubString(&prefix,this_00,0,start_00);
    UnicodeString::tempSubString(&suffix,this_00,iVar4 + 2,0x7fffffff);
    uVar6 = prefix.fUnion.fFields.fLength;
    if (-1 < prefix.fUnion.fStackFields.fLengthAndFlags) {
      uVar6 = (int)prefix.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    iVar3 = UnicodeString::doCompare(str,iVar7 - uVar6,uVar6,&prefix,0,uVar6);
    bVar2 = true;
    if (iVar3 == '\0') {
      uVar6 = suffix.fUnion.fFields.fLength;
      if (-1 < suffix.fUnion.fStackFields.fLengthAndFlags) {
        uVar6 = (int)suffix.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar3 = UnicodeString::doCompare(str,start,uVar6,&suffix,0,uVar6);
      if (iVar3 == '\0') {
        if (-1 < prefix.fUnion.fStackFields.fLengthAndFlags) {
          prefix.fUnion.fFields.fLength = (int)prefix.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (-1 < suffix.fUnion.fStackFields.fLengthAndFlags) {
          suffix.fUnion.fFields.fLength = (int)suffix.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        *length = (start - iVar7) + prefix.fUnion.fFields.fLength + suffix.fUnion.fFields.fLength;
        iVar7 = iVar7 - prefix.fUnion.fFields.fLength;
        bVar2 = false;
      }
    }
    UnicodeString::~UnicodeString(&suffix);
    UnicodeString::~UnicodeString(&prefix);
    if (!bVar2) goto LAB_00251604;
  }
  *length = 0;
  iVar7 = -1;
LAB_00251604:
  FieldPosition::~FieldPosition(&local_138);
  Formattable::~Formattable(&result);
  return iVar7;
}

Assistant:

int32_t
NFRule::findText(const UnicodeString& str,
                 const UnicodeString& key,
                 int32_t startingAt,
                 int32_t* length) const
{
    if (rulePatternFormat) {
        Formattable result;
        FieldPosition position(UNUM_INTEGER_FIELD);
        position.setBeginIndex(startingAt);
        rulePatternFormat->parseType(str, this, result, position);
        int start = position.getBeginIndex();
        if (start >= 0) {
            int32_t pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
            int32_t pluralRuleSuffix = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart) + 2;
            int32_t matchLen = position.getEndIndex() - start;
            UnicodeString prefix(fRuleText.tempSubString(0, pluralRuleStart));
            UnicodeString suffix(fRuleText.tempSubString(pluralRuleSuffix));
            if (str.compare(start - prefix.length(), prefix.length(), prefix, 0, prefix.length()) == 0
                    && str.compare(start + matchLen, suffix.length(), suffix, 0, suffix.length()) == 0)
            {
                *length = matchLen + prefix.length() + suffix.length();
                return start - prefix.length();
            }
        }
        *length = 0;
        return -1;
    }
    if (!formatter->isLenient()) {
        // if lenient parsing is turned off, this is easy: just call
        // String.indexOf() and we're done
        *length = key.length();
        return str.indexOf(key, startingAt);
    }
    else {
        // but if lenient parsing is turned ON, we've got some work
        // ahead of us
        return findTextLenient(str, key, startingAt, length);
    }
}